

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O1

Field * google::protobuf::util::converter::FindFieldInTypeByNumberOrNull(Type *type,int32 number)

{
  int iVar1;
  bool bVar2;
  Type *pTVar3;
  Type *unaff_RBX;
  int iVar4;
  
  if (type != (Type *)0x0) {
    iVar4 = (type->fields_).super_RepeatedPtrFieldBase.current_size_;
    bVar2 = 0 < iVar4;
    if (0 < iVar4) {
      pTVar3 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::Field>::TypeHandler>
                         (&(type->fields_).super_RepeatedPtrFieldBase,0);
      unaff_RBX = pTVar3;
      if (pTVar3->number_ != number) {
        iVar4 = 1;
        do {
          iVar1 = (type->fields_).super_RepeatedPtrFieldBase.current_size_;
          bVar2 = iVar4 < iVar1;
          unaff_RBX = pTVar3;
          if (iVar1 <= iVar4) break;
          unaff_RBX = protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<google::protobuf::Field>::TypeHandler>
                                (&(type->fields_).super_RepeatedPtrFieldBase,iVar4);
          iVar4 = iVar4 + 1;
        } while (unaff_RBX->number_ != number);
      }
    }
    if (bVar2) {
      return unaff_RBX;
    }
  }
  return (Field *)0x0;
}

Assistant:

const google::protobuf::Field* FindFieldInTypeByNumberOrNull(
    const google::protobuf::Type* type, int32 number) {
  if (type != nullptr) {
    for (int i = 0; i < type->fields_size(); ++i) {
      const google::protobuf::Field& field = type->fields(i);
      if (field.number() == number) {
        return &field;
      }
    }
  }
  return nullptr;
}